

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O1

void mcode_allocarea(jit_State *J)

{
  MCode *pMVar1;
  bool bVar2;
  uint uVar3;
  long *__addr;
  ulong __len;
  int iVar4;
  MCode *__addr_00;
  ulong uVar5;
  ulong uVar6;
  long *unaff_R13;
  bool bVar7;
  bool bVar8;
  
  pMVar1 = J->mcarea;
  uVar6 = (long)J->param[0xc] * 0x400 + 0xfff;
  __len = uVar6 & 0xfffffffffffff000;
  __addr_00 = pMVar1 + -__len;
  if (pMVar1 == (MCode *)0x0) {
    __addr_00 = (MCode *)0x0;
  }
  iVar4 = 0;
  do {
    __addr = unaff_R13;
    if (__addr_00 + -1 < (MCode *)0x7fffffffffff) {
      __addr = (long *)mmap64(__addr_00,__len,3,0x22,-1,0);
      if (__addr == (long *)0xffffffffffffffff) {
        __addr = (long *)0x0;
      }
      if (__addr < (long *)0x800000000000 && __addr != (long *)0x0) {
        bVar7 = 0x3fdfffff < (__len - 0x150000) + (long)__addr;
        bVar8 = 0x3fdfffff < 0x150000U - (long)__addr;
        bVar2 = bVar8 && bVar7;
        if (bVar8 && bVar7) {
LAB_0013ce03:
          munmap(__addr,__len);
          goto LAB_0013ce0f;
        }
      }
      else {
        if (__addr != (long *)0x0) goto LAB_0013ce03;
LAB_0013ce0f:
        bVar2 = true;
        __addr = unaff_R13;
      }
      if (!bVar2) {
        J->mcarea = (MCode *)__addr;
        J->szmcarea = __len;
        J->mcprot = 3;
        J->mctop = (MCode *)((long)__addr + __len);
        J->mcbot = (MCode *)(__addr + 2);
        *__addr = (long)pMVar1;
        __addr[1] = __len;
        J->szallmcarea = J->szallmcarea + __len;
        return;
      }
    }
    uVar3 = J->prngstate;
    do {
      uVar3 = uVar3 * 0x41c64e6d + 0x3039;
      uVar5 = (ulong)(uVar3 >> 1 & 0x7fff0000 ^ 0x78fb0000);
    } while (0x3fdfffff < uVar6 + uVar5);
    J->prngstate = uVar3;
    __addr_00 = (MCode *)(uVar5 - 0x1fdb0000);
    iVar4 = iVar4 + 1;
    unaff_R13 = __addr;
    if (iVar4 == 0x20) {
      lj_trace_err(J,LJ_TRERR_MCODEAL);
    }
  } while( true );
}

Assistant:

static void mcode_allocarea(jit_State *J)
{
  MCode *oldarea = J->mcarea;
  size_t sz = (size_t)J->param[JIT_P_sizemcode] << 10;
  sz = (sz + LJ_PAGESIZE-1) & ~(size_t)(LJ_PAGESIZE - 1);
  J->mcarea = (MCode *)mcode_alloc(J, sz);
  J->szmcarea = sz;
  J->mcprot = MCPROT_GEN;
  J->mctop = (MCode *)((char *)J->mcarea + J->szmcarea);
  J->mcbot = (MCode *)((char *)J->mcarea + sizeof(MCLink));
  ((MCLink *)J->mcarea)->next = oldarea;
  ((MCLink *)J->mcarea)->size = sz;
  J->szallmcarea += sz;
}